

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

int ON_DBL::Compare(double *lhs,double *rhs)

{
  double *rhs_local;
  double *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (double *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (double *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    lhs_local._4_4_ = CompareValue(*lhs,*rhs);
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_DBL::Compare(const double* lhs, const double* rhs)
{
  // sort nullptr to the end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_DBL::CompareValue(*lhs, *rhs);
}